

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RTCIntersectArguments *pRVar1;
  vfloat<4> vVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Ref<embree::Geometry> *pRVar7;
  Geometry *pGVar8;
  long lVar9;
  undefined1 auVar10 [16];
  RTCIntersectArguments *pRVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  bool bVar30;
  uint uVar31;
  undefined4 uVar32;
  int iVar33;
  AABBNodeMB4D *node1;
  ulong uVar34;
  ulong uVar35;
  RTCIntersectArguments *pRVar36;
  long lVar37;
  long lVar38;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar39;
  size_t sVar40;
  ulong uVar41;
  long lVar42;
  uint uVar43;
  NodeRef *pNVar44;
  NodeRef root;
  RTCIntersectArguments *pRVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar60;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  float fVar58;
  float fVar59;
  undefined1 in_ZMM0 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  vint4 ai_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  vint4 ai;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar104;
  float fVar116;
  float fVar117;
  vint4 ai_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar118;
  undefined1 auVar115 [16];
  vint4 ai_3;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar132;
  float fVar141;
  float fVar142;
  vint4 bi;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  undefined1 auVar140 [16];
  vint4 bi_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  vint4 bi_3;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  vint4 bi_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  float fVar164;
  float fVar165;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar166;
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar174;
  float fVar177;
  float fVar178;
  undefined1 auVar175 [16];
  float fVar179;
  undefined1 auVar176 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [64];
  Precalculations pre;
  Vec3<embree::vfloat_impl<4>_> p1;
  vuint<4> *v;
  vbool<4> terminated;
  undefined1 local_1a68 [16];
  undefined1 local_1a28 [16];
  BVH *local_1a10;
  Intersectors *local_1a08;
  long local_1a00;
  Vec3<embree::vfloat_impl<4>_> p0;
  RTCIntersectArguments local_1988;
  vint<4> itime;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 uStack_1940;
  TravRayK<4,_true> tray;
  undefined1 local_1848 [16];
  undefined1 local_1838 [16];
  undefined1 local_1828 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [8];
  float fStack_17f0;
  float fStack_17ec;
  undefined1 local_17e8 [8];
  float fStack_17e0;
  float fStack_17dc;
  undefined8 local_1718;
  undefined8 uStack_1710;
  vfloat<4> t;
  vfloat<4> v_2;
  vfloat<4> u;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  local_1a10 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1a10->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar69 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar62 = vpcmpeqd_avx(auVar69,(undefined1  [16])valid_i->field_0);
    auVar55 = ZEXT816(0) << 0x40;
    auVar10 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar55,5);
    auVar70 = auVar62 & auVar10;
    if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar70[0xf] < '\0')
    {
      auVar10 = vandps_avx(auVar10,auVar62);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar167._8_4_ = 0x7fffffff;
      auVar167._0_8_ = 0x7fffffff7fffffff;
      auVar167._12_4_ = 0x7fffffff;
      auVar62 = vandps_avx(auVar167,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar156._8_4_ = 0x219392ef;
      auVar156._0_8_ = 0x219392ef219392ef;
      auVar156._12_4_ = 0x219392ef;
      auVar70 = vcmpps_avx(auVar62,auVar156,1);
      auVar170._8_4_ = 0x3f800000;
      auVar170._0_8_ = 0x3f8000003f800000;
      auVar170._12_4_ = 0x3f800000;
      auVar119 = vdivps_avx(auVar170,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar62 = vandps_avx(auVar167,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar105 = vcmpps_avx(auVar62,auVar156,1);
      auVar120 = vdivps_avx(auVar170,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar62 = vandps_avx(auVar167,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar62 = vcmpps_avx(auVar62,auVar156,1);
      auVar157._8_4_ = 0x5d5e0b6b;
      auVar157._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar157._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar119,auVar157,auVar70)
      ;
      auVar70 = vdivps_avx(auVar170,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar120,auVar157,auVar105);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar70,auVar157,auVar62);
      auVar62 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar55,1);
      auVar119._8_4_ = 0x10;
      auVar119._0_8_ = 0x1000000010;
      auVar119._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar62,auVar119);
      auVar62 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar55,5);
      auVar70._8_4_ = 0x20;
      auVar70._0_8_ = 0x2000000020;
      auVar70._12_4_ = 0x20;
      auVar120._8_4_ = 0x30;
      auVar120._0_8_ = 0x3000000030;
      auVar120._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar120,auVar70,auVar62)
      ;
      auVar62 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar55,5);
      auVar105._8_4_ = 0x40;
      auVar105._0_8_ = 0x4000000040;
      auVar105._12_4_ = 0x40;
      auVar121._8_4_ = 0x50;
      auVar121._0_8_ = 0x5000000050;
      auVar121._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar121,auVar105,auVar62);
      auVar62 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar55);
      auVar70 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar55);
      auVar55._8_4_ = 0x7f800000;
      auVar55._0_8_ = 0x7f8000007f800000;
      auVar55._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar55,auVar62,auVar10);
      auVar62._8_4_ = 0xff800000;
      auVar62._0_8_ = 0xff800000ff800000;
      auVar62._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar62,auVar70,auVar10);
      terminated.field_0.i[1] = auVar10._4_4_ ^ auVar69._4_4_;
      terminated.field_0.i[0] = auVar10._0_4_ ^ auVar69._0_4_;
      terminated.field_0.i[2] = auVar10._8_4_ ^ auVar69._8_4_;
      terminated.field_0.i[3] = auVar10._12_4_ ^ auVar69._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar43 = 3;
      }
      else {
        uVar43 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = (RTCIntersectArguments *)(ray + 0x80);
      pNVar44 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar39 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar182 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      pRVar36 = pRVar1;
      local_1a08 = This;
LAB_01547f98:
      do {
        do {
          root.ptr = pNVar44[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01549055;
          pNVar44 = pNVar44 + -1;
          paVar39 = paVar39 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar39->v;
          auVar76 = ZEXT1664((undefined1  [16])vVar2.field_0);
          auVar69 = vcmpps_avx((undefined1  [16])vVar2.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar31 = vmovmskps_avx(auVar69);
        } while (uVar31 == 0);
        uVar34 = (ulong)(uVar31 & 0xff);
        uVar31 = POPCOUNT(uVar31 & 0xff);
        if (uVar43 < uVar31) {
LAB_01547fd8:
          do {
            lVar37 = -0x10;
            uVar31 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01549055;
              auVar69 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar76._0_16_,6);
              if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar69 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar69 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar69[0xf]) goto LAB_01547f98;
              local_1a00 = (ulong)(uVar31 & 0xf) - 8;
              auVar69 = vpcmpeqd_avx(auVar69,auVar69);
              lVar37 = 0;
              local_1a68 = auVar69 ^ (undefined1  [16])terminated.field_0;
              goto LAB_0154829a;
            }
            uVar34 = root.ptr & 0xfffffffffffffff0;
            pRVar36 = (RTCIntersectArguments *)0x0;
            auVar69 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar76._0_16_,6);
            auVar76 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            root.ptr = 8;
            for (; (aVar61 = auVar76._0_16_, lVar37 != 0 &&
                   (sVar40 = *(size_t *)(uVar34 + 0x20 + lVar37 * 2), sVar40 != 8));
                lVar37 = lVar37 + 4) {
              uVar32 = *(undefined4 *)(uVar34 + 0x90 + lVar37);
              auVar77._4_4_ = uVar32;
              auVar77._0_4_ = uVar32;
              auVar77._8_4_ = uVar32;
              auVar77._12_4_ = uVar32;
              uVar32 = *(undefined4 *)(uVar34 + 0x30 + lVar37);
              auVar95._4_4_ = uVar32;
              auVar95._0_4_ = uVar32;
              auVar95._8_4_ = uVar32;
              auVar95._12_4_ = uVar32;
              auVar62 = *(undefined1 (*) [16])(ray + 0x70);
              auVar70 = vfmadd231ps_fma(auVar95,auVar62,auVar77);
              uVar32 = *(undefined4 *)(uVar34 + 0xb0 + lVar37);
              auVar78._4_4_ = uVar32;
              auVar78._0_4_ = uVar32;
              auVar78._8_4_ = uVar32;
              auVar78._12_4_ = uVar32;
              uVar32 = *(undefined4 *)(uVar34 + 0x50 + lVar37);
              auVar106._4_4_ = uVar32;
              auVar106._0_4_ = uVar32;
              auVar106._8_4_ = uVar32;
              auVar106._12_4_ = uVar32;
              auVar55 = vfmadd231ps_fma(auVar106,auVar62,auVar78);
              uVar32 = *(undefined4 *)(uVar34 + 0xd0 + lVar37);
              auVar79._4_4_ = uVar32;
              auVar79._0_4_ = uVar32;
              auVar79._8_4_ = uVar32;
              auVar79._12_4_ = uVar32;
              uVar32 = *(undefined4 *)(uVar34 + 0x70 + lVar37);
              auVar122._4_4_ = uVar32;
              auVar122._0_4_ = uVar32;
              auVar122._8_4_ = uVar32;
              auVar122._12_4_ = uVar32;
              auVar105 = vfmadd231ps_fma(auVar122,auVar62,auVar79);
              uVar32 = *(undefined4 *)(uVar34 + 0xa0 + lVar37);
              auVar80._4_4_ = uVar32;
              auVar80._0_4_ = uVar32;
              auVar80._8_4_ = uVar32;
              auVar80._12_4_ = uVar32;
              uVar32 = *(undefined4 *)(uVar34 + 0x40 + lVar37);
              auVar133._4_4_ = uVar32;
              auVar133._0_4_ = uVar32;
              auVar133._8_4_ = uVar32;
              auVar133._12_4_ = uVar32;
              auVar119 = vfmadd231ps_fma(auVar133,auVar62,auVar80);
              uVar32 = *(undefined4 *)(uVar34 + 0xc0 + lVar37);
              auVar81._4_4_ = uVar32;
              auVar81._0_4_ = uVar32;
              auVar81._8_4_ = uVar32;
              auVar81._12_4_ = uVar32;
              uVar32 = *(undefined4 *)(uVar34 + 0x60 + lVar37);
              auVar144._4_4_ = uVar32;
              auVar144._0_4_ = uVar32;
              auVar144._8_4_ = uVar32;
              auVar144._12_4_ = uVar32;
              auVar120 = vfmadd231ps_fma(auVar144,auVar62,auVar81);
              uVar32 = *(undefined4 *)(uVar34 + 0xe0 + lVar37);
              auVar82._4_4_ = uVar32;
              auVar82._0_4_ = uVar32;
              auVar82._8_4_ = uVar32;
              auVar82._12_4_ = uVar32;
              uVar32 = *(undefined4 *)(uVar34 + 0x80 + lVar37);
              auVar149._4_4_ = uVar32;
              auVar149._0_4_ = uVar32;
              auVar149._8_4_ = uVar32;
              auVar149._12_4_ = uVar32;
              auVar121 = vfmadd231ps_fma(auVar149,auVar62,auVar82);
              auVar12._8_8_ = tray.org.field_0._8_8_;
              auVar12._0_8_ = tray.org.field_0._0_8_;
              auVar13._8_8_ = tray.org.field_0._24_8_;
              auVar13._0_8_ = tray.org.field_0._16_8_;
              auVar14._8_8_ = tray.org.field_0._40_8_;
              auVar14._0_8_ = tray.org.field_0._32_8_;
              auVar70 = vsubps_avx(auVar70,auVar12);
              auVar96._0_4_ = tray.rdir.field_0._0_4_ * auVar70._0_4_;
              auVar96._4_4_ = tray.rdir.field_0._4_4_ * auVar70._4_4_;
              auVar96._8_4_ = tray.rdir.field_0._8_4_ * auVar70._8_4_;
              auVar96._12_4_ = tray.rdir.field_0._12_4_ * auVar70._12_4_;
              auVar70 = vsubps_avx(auVar55,auVar13);
              auVar107._0_4_ = tray.rdir.field_0._16_4_ * auVar70._0_4_;
              auVar107._4_4_ = tray.rdir.field_0._20_4_ * auVar70._4_4_;
              auVar107._8_4_ = tray.rdir.field_0._24_4_ * auVar70._8_4_;
              auVar107._12_4_ = tray.rdir.field_0._28_4_ * auVar70._12_4_;
              auVar70 = vsubps_avx(auVar105,auVar14);
              auVar123._0_4_ = tray.rdir.field_0._32_4_ * auVar70._0_4_;
              auVar123._4_4_ = tray.rdir.field_0._36_4_ * auVar70._4_4_;
              auVar123._8_4_ = tray.rdir.field_0._40_4_ * auVar70._8_4_;
              auVar123._12_4_ = tray.rdir.field_0._44_4_ * auVar70._12_4_;
              auVar70 = vsubps_avx(auVar119,auVar12);
              auVar134._0_4_ = tray.rdir.field_0._0_4_ * auVar70._0_4_;
              auVar134._4_4_ = tray.rdir.field_0._4_4_ * auVar70._4_4_;
              auVar134._8_4_ = tray.rdir.field_0._8_4_ * auVar70._8_4_;
              auVar134._12_4_ = tray.rdir.field_0._12_4_ * auVar70._12_4_;
              auVar70 = vsubps_avx(auVar120,auVar13);
              auVar145._0_4_ = tray.rdir.field_0._16_4_ * auVar70._0_4_;
              auVar145._4_4_ = tray.rdir.field_0._20_4_ * auVar70._4_4_;
              auVar145._8_4_ = tray.rdir.field_0._24_4_ * auVar70._8_4_;
              auVar145._12_4_ = tray.rdir.field_0._28_4_ * auVar70._12_4_;
              auVar70 = vsubps_avx(auVar121,auVar14);
              auVar150._0_4_ = tray.rdir.field_0._32_4_ * auVar70._0_4_;
              auVar150._4_4_ = tray.rdir.field_0._36_4_ * auVar70._4_4_;
              auVar150._8_4_ = tray.rdir.field_0._40_4_ * auVar70._8_4_;
              auVar150._12_4_ = tray.rdir.field_0._44_4_ * auVar70._12_4_;
              auVar70 = vpminsd_avx(auVar96,auVar134);
              auVar55 = vpminsd_avx(auVar107,auVar145);
              auVar70 = vpmaxsd_avx(auVar70,auVar55);
              auVar55 = vpminsd_avx(auVar123,auVar150);
              auVar70 = vpmaxsd_avx(auVar70,auVar55);
              auVar83._0_4_ = auVar182._0_4_ * auVar70._0_4_;
              auVar83._4_4_ = auVar182._4_4_ * auVar70._4_4_;
              auVar83._8_4_ = auVar182._8_4_ * auVar70._8_4_;
              auVar83._12_4_ = auVar182._12_4_ * auVar70._12_4_;
              auVar70 = vpmaxsd_avx(auVar96,auVar134);
              auVar55 = vpmaxsd_avx(auVar107,auVar145);
              auVar55 = vpminsd_avx(auVar70,auVar55);
              auVar70 = vpmaxsd_avx(auVar123,auVar150);
              auVar55 = vpminsd_avx(auVar55,auVar70);
              auVar70 = vpmaxsd_avx(auVar83,(undefined1  [16])tray.tnear.field_0);
              auVar108._0_4_ = auVar55._0_4_ * 1.0000004;
              auVar108._4_4_ = auVar55._4_4_ * 1.0000004;
              auVar108._8_4_ = auVar55._8_4_ * 1.0000004;
              auVar108._12_4_ = auVar55._12_4_ * 1.0000004;
              auVar55 = vpminsd_avx(auVar108,(undefined1  [16])tray.tfar.field_0);
              if ((uVar31 & 7) == 6) {
                auVar70 = vcmpps_avx(auVar70,auVar55,2);
                uVar32 = *(undefined4 *)(uVar34 + 0xf0 + lVar37);
                auVar109._4_4_ = uVar32;
                auVar109._0_4_ = uVar32;
                auVar109._8_4_ = uVar32;
                auVar109._12_4_ = uVar32;
                auVar55 = vcmpps_avx(auVar109,auVar62,2);
                uVar32 = *(undefined4 *)(uVar34 + 0x100 + lVar37);
                auVar124._4_4_ = uVar32;
                auVar124._0_4_ = uVar32;
                auVar124._8_4_ = uVar32;
                auVar124._12_4_ = uVar32;
                auVar62 = vcmpps_avx(auVar62,auVar124,1);
                auVar62 = vandps_avx(auVar55,auVar62);
                auVar62 = vandps_avx(auVar62,auVar70);
              }
              else {
                auVar62 = vcmpps_avx(auVar70,auVar55,2);
              }
              auVar62 = vandps_avx(auVar62,auVar69);
              auVar62 = vpslld_avx(auVar62,0x1f);
              if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar62 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar62[0xf]) {
                auVar76 = ZEXT1664((undefined1  [16])aVar61);
                sVar40 = root.ptr;
              }
              else {
                auVar97._8_4_ = 0x7f800000;
                auVar97._0_8_ = 0x7f8000007f800000;
                auVar97._12_4_ = 0x7f800000;
                auVar62 = vblendvps_avx(auVar97,auVar83,auVar62);
                auVar76 = ZEXT1664(auVar62);
                if (root.ptr != 8) {
                  pNVar44->ptr = root.ptr;
                  pNVar44 = pNVar44 + 1;
                  *paVar39 = aVar61;
                  paVar39 = paVar39 + 1;
                }
              }
              root.ptr = sVar40;
            }
            if (root.ptr == 8) goto LAB_0154822f;
            auVar69 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar61,6);
            uVar32 = vmovmskps_avx(auVar69);
          } while ((byte)uVar43 < (byte)POPCOUNT(uVar32));
          pNVar44->ptr = root.ptr;
          pNVar44 = pNVar44 + 1;
          *paVar39 = aVar61;
          paVar39 = paVar39 + 1;
LAB_0154822f:
          iVar33 = 4;
        }
        else {
          while (uVar34 != 0) {
            pRVar11 = (RTCIntersectArguments *)0x0;
            for (uVar35 = uVar34; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
              pRVar11 = (RTCIntersectArguments *)((long)&pRVar11->flags + 1);
            }
            uVar34 = uVar34 - 1 & uVar34;
            pRVar36 = pRVar11;
            bVar30 = occluded1(local_1a08,local_1a10,root,(size_t)pRVar11,&pre,ray,&tray,context);
            if (bVar30) {
              *(undefined4 *)(local_1a68 + (long)pRVar11 * 4 + -0x10) = 0xffffffff;
            }
          }
          auVar69 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar33 = 3;
          auVar182 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar69[0xf] < '\0') {
            auVar69._8_4_ = 0xff800000;
            auVar69._0_8_ = 0xff800000ff800000;
            auVar69._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar69,
                               (undefined1  [16])terminated.field_0);
            iVar33 = 2;
          }
          auVar76 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if (uVar43 < uVar31) goto LAB_01547fd8;
        }
      } while ((iVar33 == 4) || (iVar33 == 2));
LAB_01549055:
      auVar10 = vandps_avx(auVar10,(undefined1  [16])terminated.field_0);
      auVar75._8_4_ = 0xff800000;
      auVar75._0_8_ = 0xff800000ff800000;
      auVar75._12_4_ = 0xff800000;
      auVar10 = vmaskmovps_avx(auVar10,auVar75);
      pRVar1->flags = auVar10._0_4_;
      pRVar1->feature_mask = auVar10._4_4_;
      pRVar1->context = (RTCRayQueryContext *)auVar10._8_8_;
    }
  }
  return;
LAB_0154829a:
  do {
    auVar69 = auVar76._0_16_;
    if (lVar37 == local_1a00) break;
    lVar38 = lVar37 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    uVar32 = vmovmskps_avx(local_1a68);
    pRVar11 = (RTCIntersectArguments *)0x0;
    uVar35 = CONCAT44((int)((ulong)pRVar36 >> 0x20),uVar32);
    for (uVar34 = uVar35; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
      pRVar11 = (RTCIntersectArguments *)((long)&pRVar11->flags + 1);
    }
    pRVar45 = (RTCIntersectArguments *)0x0;
    pRVar36 = pRVar11;
    auVar62 = local_1a68;
    do {
      if ((pRVar45 == (RTCIntersectArguments *)&DAT_00000004) ||
         (*(int *)(lVar38 + 0x40 + (long)pRVar45 * 4) == -1)) break;
      pRVar7 = (context->scene->geometries).items;
      pGVar8 = pRVar7[*(uint *)(lVar38 + 0x30 + (long)pRVar45 * 4)].ptr;
      fVar46 = (pGVar8->time_range).lower;
      auVar47._4_4_ = fVar46;
      auVar47._0_4_ = fVar46;
      auVar47._8_4_ = fVar46;
      auVar47._12_4_ = fVar46;
      fVar58 = pGVar8->fnumTimeSegments;
      auVar69 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar47);
      fVar46 = (pGVar8->time_range).upper - fVar46;
      auVar48._4_4_ = fVar46;
      auVar48._0_4_ = fVar46;
      auVar48._8_4_ = fVar46;
      auVar48._12_4_ = fVar46;
      auVar69 = vdivps_avx(auVar69,auVar48);
      auVar49._0_4_ = fVar58 * auVar69._0_4_;
      auVar49._4_4_ = fVar58 * auVar69._4_4_;
      auVar49._8_4_ = fVar58 * auVar69._8_4_;
      auVar49._12_4_ = fVar58 * auVar69._12_4_;
      auVar69 = vroundps_avx(auVar49,1);
      fVar58 = fVar58 + -1.0;
      auVar84._4_4_ = fVar58;
      auVar84._0_4_ = fVar58;
      auVar84._8_4_ = fVar58;
      auVar84._12_4_ = fVar58;
      auVar69 = vminps_avx(auVar69,auVar84);
      auVar69 = vmaxps_avx(auVar69,_DAT_01f45a50);
      auVar70 = vsubps_avx(auVar49,auVar69);
      itime.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar69);
      iVar33 = itime.field_0.i[(long)pRVar11];
      auVar85._4_4_ = iVar33;
      auVar85._0_4_ = iVar33;
      auVar85._8_4_ = iVar33;
      auVar85._12_4_ = iVar33;
      auVar69 = vpcmpeqd_avx(auVar85,(undefined1  [16])itime.field_0);
      auVar69 = local_1a68 & ~auVar69;
      fVar58 = auVar70._4_4_;
      fVar59 = auVar70._8_4_;
      fVar60 = auVar70._12_4_;
      fVar46 = auVar70._0_4_;
      uVar34 = uVar35;
      pRVar36 = pRVar11;
      if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar69 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar69 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar69[0xf])
      {
        lVar42 = *(long *)(*(long *)&pGVar8[2].numPrimitives + (long)iVar33 * 0x38);
        lVar9 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + (long)iVar33 * 0x38);
        uVar34 = (ulong)*(uint *)(lVar38 + (long)pRVar45 * 4);
        uVar41 = (ulong)*(uint *)(lVar38 + 0x10 + (long)pRVar45 * 4);
        uVar32 = *(undefined4 *)(lVar42 + uVar34 * 4);
        auVar98._4_4_ = uVar32;
        auVar98._0_4_ = uVar32;
        auVar98._8_4_ = uVar32;
        auVar98._12_4_ = uVar32;
        uVar32 = *(undefined4 *)(lVar42 + 4 + uVar34 * 4);
        auVar110._4_4_ = uVar32;
        auVar110._0_4_ = uVar32;
        auVar110._8_4_ = uVar32;
        auVar110._12_4_ = uVar32;
        uVar32 = *(undefined4 *)(lVar42 + 8 + uVar34 * 4);
        auVar135._4_4_ = uVar32;
        auVar135._0_4_ = uVar32;
        auVar135._8_4_ = uVar32;
        auVar135._12_4_ = uVar32;
        fVar104 = *(float *)(lVar9 + uVar34 * 4);
        fVar116 = *(float *)(lVar9 + 4 + uVar34 * 4);
        fVar117 = *(float *)(lVar9 + 8 + uVar34 * 4);
        auVar86._8_4_ = 0x3f800000;
        auVar86._0_8_ = 0x3f8000003f800000;
        auVar86._12_4_ = 0x3f800000;
        auVar69 = vsubps_avx(auVar86,auVar70);
        auVar87._0_4_ = fVar46 * fVar104;
        auVar87._4_4_ = fVar58 * fVar104;
        auVar87._8_4_ = fVar59 * fVar104;
        auVar87._12_4_ = fVar60 * fVar104;
        auVar63._0_4_ = fVar46 * fVar116;
        auVar63._4_4_ = fVar58 * fVar116;
        auVar63._8_4_ = fVar59 * fVar116;
        auVar63._12_4_ = fVar60 * fVar116;
        auVar125._0_4_ = fVar46 * fVar117;
        auVar125._4_4_ = fVar58 * fVar117;
        auVar125._8_4_ = fVar59 * fVar117;
        auVar125._12_4_ = fVar60 * fVar117;
        auVar92 = vfmadd231ps_fma(auVar87,auVar69,auVar98);
        auVar74 = vfmadd231ps_fma(auVar63,auVar69,auVar110);
        auVar131 = vfmadd231ps_fma(auVar125,auVar69,auVar135);
        uVar32 = *(undefined4 *)(lVar42 + uVar41 * 4);
        auVar146._4_4_ = uVar32;
        auVar146._0_4_ = uVar32;
        auVar146._8_4_ = uVar32;
        auVar146._12_4_ = uVar32;
        uVar32 = *(undefined4 *)(lVar42 + 4 + uVar41 * 4);
        auVar151._4_4_ = uVar32;
        auVar151._0_4_ = uVar32;
        auVar151._8_4_ = uVar32;
        auVar151._12_4_ = uVar32;
        uVar32 = *(undefined4 *)(lVar42 + 8 + uVar41 * 4);
        auVar160._4_4_ = uVar32;
        auVar160._0_4_ = uVar32;
        auVar160._8_4_ = uVar32;
        auVar160._12_4_ = uVar32;
        fVar104 = *(float *)(lVar9 + uVar41 * 4);
        fVar116 = *(float *)(lVar9 + 4 + uVar41 * 4);
        fVar117 = *(float *)(lVar9 + 8 + uVar41 * 4);
        auVar111._0_4_ = fVar46 * fVar104;
        auVar111._4_4_ = fVar58 * fVar104;
        auVar111._8_4_ = fVar59 * fVar104;
        auVar111._12_4_ = fVar60 * fVar104;
        auVar99._0_4_ = fVar46 * fVar116;
        auVar99._4_4_ = fVar58 * fVar116;
        auVar99._8_4_ = fVar59 * fVar116;
        auVar99._12_4_ = fVar60 * fVar116;
        auVar136._0_4_ = fVar117 * fVar46;
        auVar136._4_4_ = fVar117 * fVar58;
        auVar136._8_4_ = fVar117 * fVar59;
        auVar136._12_4_ = fVar117 * fVar60;
        auVar115 = vfmadd231ps_fma(auVar111,auVar69,auVar146);
        auVar103 = vfmadd231ps_fma(auVar99,auVar69,auVar151);
        auVar140 = vfmadd231ps_fma(auVar136,auVar69,auVar160);
        uVar34 = (ulong)*(uint *)(lVar38 + 0x20 + (long)pRVar45 * 4);
        uVar32 = *(undefined4 *)(lVar42 + uVar34 * 4);
        auVar168._4_4_ = uVar32;
        auVar168._0_4_ = uVar32;
        auVar168._8_4_ = uVar32;
        auVar168._12_4_ = uVar32;
        uVar32 = *(undefined4 *)(lVar42 + 4 + uVar34 * 4);
        auVar171._4_4_ = uVar32;
        auVar171._0_4_ = uVar32;
        auVar171._8_4_ = uVar32;
        auVar171._12_4_ = uVar32;
        uVar32 = *(undefined4 *)(lVar42 + 8 + uVar34 * 4);
        auVar172._4_4_ = uVar32;
        auVar172._0_4_ = uVar32;
        auVar172._8_4_ = uVar32;
        auVar172._12_4_ = uVar32;
        fVar104 = *(float *)(lVar9 + uVar34 * 4);
        fVar116 = *(float *)(lVar9 + 4 + uVar34 * 4);
        fVar117 = *(float *)(lVar9 + 8 + uVar34 * 4);
        auVar175._0_4_ = fVar46 * fVar104;
        auVar175._4_4_ = fVar58 * fVar104;
        auVar175._8_4_ = fVar59 * fVar104;
        auVar175._12_4_ = fVar60 * fVar104;
        auVar152._0_4_ = fVar116 * fVar46;
        auVar152._4_4_ = fVar116 * fVar58;
        auVar152._8_4_ = fVar116 * fVar59;
        auVar152._12_4_ = fVar116 * fVar60;
        auVar161._0_4_ = fVar117 * fVar46;
        auVar161._4_4_ = fVar117 * fVar58;
        auVar161._8_4_ = fVar117 * fVar59;
        auVar161._12_4_ = fVar117 * fVar60;
        auVar176 = vfmadd231ps_fma(auVar175,auVar69,auVar168);
        auVar155 = vfmadd231ps_fma(auVar152,auVar69,auVar171);
        auVar163 = vfmadd231ps_fma(auVar161,auVar69,auVar172);
      }
      else {
        while (uVar34 != 0) {
          lVar42 = (long)itime.field_0.i[(long)pRVar36] * 0x38;
          uVar41 = (ulong)*(uint *)(lVar38 + (long)pRVar45 * 4);
          auVar69 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar8[2].numPrimitives + lVar42) + uVar41 * 4);
          auVar55 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar42) + uVar41 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar36 * 4) = auVar69._0_4_;
          uVar32 = vextractps_avx(auVar69,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar36 * 4 + 0x10) = uVar32;
          uVar32 = vextractps_avx(auVar69,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar36 * 4 + 0x20) = uVar32;
          *(int *)((long)&p1.field_0 + (long)pRVar36 * 4) = auVar55._0_4_;
          uVar32 = vextractps_avx(auVar55,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar36 * 4 + 0x10) = uVar32;
          uVar32 = vextractps_avx(auVar55,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar36 * 4 + 0x20) = uVar32;
          uVar41 = (ulong)pRVar36 & 0x3f;
          pRVar36 = (RTCIntersectArguments *)0x0;
          uVar34 = uVar34 ^ 1L << uVar41;
          for (uVar41 = uVar34; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
            pRVar36 = (RTCIntersectArguments *)((long)&pRVar36->flags + 1);
          }
        }
        auVar73._8_4_ = 0x3f800000;
        auVar73._0_8_ = 0x3f8000003f800000;
        auVar73._12_4_ = 0x3f800000;
        auVar69 = vsubps_avx(auVar73,auVar70);
        uVar19 = p0.field_0._0_4_;
        uVar20 = p0.field_0._4_4_;
        uVar21 = p0.field_0._8_4_;
        uVar22 = p0.field_0._12_4_;
        uVar23 = p0.field_0._32_4_;
        uVar24 = p0.field_0._36_4_;
        uVar26 = p0.field_0._40_4_;
        uVar28 = p0.field_0._44_4_;
        fVar104 = auVar69._0_4_;
        fVar116 = auVar69._4_4_;
        fVar117 = auVar69._8_4_;
        fVar118 = auVar69._12_4_;
        uVar32 = p1.field_0._0_4_;
        uVar16 = p1.field_0._4_4_;
        uVar17 = p1.field_0._8_4_;
        uVar18 = p1.field_0._12_4_;
        auVar74._0_4_ = fVar104 * (float)p0.field_0._16_4_ + fVar46 * (float)p1.field_0._16_4_;
        auVar74._4_4_ = fVar116 * (float)p0.field_0._20_4_ + fVar58 * (float)p1.field_0._20_4_;
        auVar74._8_4_ = fVar117 * (float)p0.field_0._24_4_ + fVar59 * (float)p1.field_0._24_4_;
        auVar74._12_4_ = fVar118 * (float)p0.field_0._28_4_ + fVar60 * (float)p1.field_0._28_4_;
        fVar132 = fVar46 * (float)p1.field_0._32_4_;
        fVar141 = fVar58 * (float)p1.field_0._36_4_;
        fVar142 = fVar59 * (float)p1.field_0._40_4_;
        fVar143 = fVar60 * (float)p1.field_0._44_4_;
        uVar34 = uVar35;
        pRVar36 = pRVar11;
        while (uVar34 != 0) {
          lVar42 = (long)itime.field_0.i[(long)pRVar36] * 0x38;
          uVar41 = (ulong)*(uint *)(lVar38 + 0x10 + (long)pRVar45 * 4);
          auVar69 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar8[2].numPrimitives + lVar42) + uVar41 * 4);
          auVar70 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar42) + uVar41 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar36 * 4) = auVar69._0_4_;
          uVar5 = vextractps_avx(auVar69,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar36 * 4 + 0x10) = uVar5;
          uVar5 = vextractps_avx(auVar69,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar36 * 4 + 0x20) = uVar5;
          *(int *)((long)&p1.field_0 + (long)pRVar36 * 4) = auVar70._0_4_;
          uVar5 = vextractps_avx(auVar70,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar36 * 4 + 0x10) = uVar5;
          uVar5 = vextractps_avx(auVar70,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar36 * 4 + 0x20) = uVar5;
          uVar41 = (ulong)pRVar36 & 0x3f;
          pRVar36 = (RTCIntersectArguments *)0x0;
          uVar34 = uVar34 ^ 1L << uVar41;
          for (uVar41 = uVar34; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
            pRVar36 = (RTCIntersectArguments *)((long)&pRVar36->flags + 1);
          }
        }
        auVar92._0_4_ = fVar104 * (float)uVar19 + fVar46 * (float)uVar32;
        auVar92._4_4_ = fVar116 * (float)uVar20 + fVar58 * (float)uVar16;
        auVar92._8_4_ = fVar117 * (float)uVar21 + fVar59 * (float)uVar17;
        auVar92._12_4_ = fVar118 * (float)uVar22 + fVar60 * (float)uVar18;
        uVar19 = p0.field_0._0_4_;
        uVar20 = p0.field_0._4_4_;
        uVar21 = p0.field_0._8_4_;
        uVar22 = p0.field_0._12_4_;
        uVar5 = p0.field_0._32_4_;
        uVar25 = p0.field_0._36_4_;
        uVar27 = p0.field_0._40_4_;
        uVar29 = p0.field_0._44_4_;
        uVar32 = p1.field_0._0_4_;
        uVar16 = p1.field_0._4_4_;
        uVar17 = p1.field_0._8_4_;
        uVar18 = p1.field_0._12_4_;
        auVar103._0_4_ = fVar46 * (float)p1.field_0._16_4_ + fVar104 * (float)p0.field_0._16_4_;
        auVar103._4_4_ = fVar58 * (float)p1.field_0._20_4_ + fVar116 * (float)p0.field_0._20_4_;
        auVar103._8_4_ = fVar59 * (float)p1.field_0._24_4_ + fVar117 * (float)p0.field_0._24_4_;
        auVar103._12_4_ = fVar60 * (float)p1.field_0._28_4_ + fVar118 * (float)p0.field_0._28_4_;
        fVar159 = fVar46 * (float)p1.field_0._32_4_;
        fVar164 = fVar58 * (float)p1.field_0._36_4_;
        fVar165 = fVar59 * (float)p1.field_0._40_4_;
        fVar166 = fVar60 * (float)p1.field_0._44_4_;
        uVar34 = uVar35;
        pRVar36 = pRVar11;
        while (uVar34 != 0) {
          lVar42 = (long)itime.field_0.i[(long)pRVar36] * 0x38;
          uVar41 = (ulong)*(uint *)(lVar38 + 0x20 + (long)pRVar45 * 4);
          auVar69 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar8[2].numPrimitives + lVar42) + uVar41 * 4);
          auVar70 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar42) + uVar41 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar36 * 4) = auVar69._0_4_;
          uVar6 = vextractps_avx(auVar69,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar36 * 4 + 0x10) = uVar6;
          uVar6 = vextractps_avx(auVar69,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar36 * 4 + 0x20) = uVar6;
          *(int *)((long)&p1.field_0 + (long)pRVar36 * 4) = auVar70._0_4_;
          uVar6 = vextractps_avx(auVar70,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar36 * 4 + 0x10) = uVar6;
          uVar6 = vextractps_avx(auVar70,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar36 * 4 + 0x20) = uVar6;
          uVar41 = (ulong)pRVar36 & 0x3f;
          pRVar36 = (RTCIntersectArguments *)0x0;
          uVar34 = uVar34 ^ 1L << uVar41;
          for (uVar41 = uVar34; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
            pRVar36 = (RTCIntersectArguments *)((long)&pRVar36->flags + 1);
          }
        }
        auVar131._0_4_ = fVar104 * (float)uVar23 + fVar132;
        auVar131._4_4_ = fVar116 * (float)uVar24 + fVar141;
        auVar131._8_4_ = fVar117 * (float)uVar26 + fVar142;
        auVar131._12_4_ = fVar118 * (float)uVar28 + fVar143;
        auVar140._0_4_ = fVar159 + (float)uVar5 * fVar104;
        auVar140._4_4_ = fVar164 + (float)uVar25 * fVar116;
        auVar140._8_4_ = fVar165 + (float)uVar27 * fVar117;
        auVar140._12_4_ = fVar166 + (float)uVar29 * fVar118;
        auVar115._0_4_ = (float)uVar32 * fVar46 + fVar104 * (float)uVar19;
        auVar115._4_4_ = (float)uVar16 * fVar58 + fVar116 * (float)uVar20;
        auVar115._8_4_ = (float)uVar17 * fVar59 + fVar117 * (float)uVar21;
        auVar115._12_4_ = (float)uVar18 * fVar60 + fVar118 * (float)uVar22;
        auVar176._0_4_ = fVar104 * (float)p0.field_0._0_4_ + fVar46 * (float)p1.field_0._0_4_;
        auVar176._4_4_ = fVar116 * (float)p0.field_0._4_4_ + fVar58 * (float)p1.field_0._4_4_;
        auVar176._8_4_ = fVar117 * (float)p0.field_0._8_4_ + fVar59 * (float)p1.field_0._8_4_;
        auVar176._12_4_ = fVar118 * (float)p0.field_0._12_4_ + fVar60 * (float)p1.field_0._12_4_;
        auVar155._0_4_ = fVar104 * (float)p0.field_0._16_4_ + fVar46 * (float)p1.field_0._16_4_;
        auVar155._4_4_ = fVar116 * (float)p0.field_0._20_4_ + fVar58 * (float)p1.field_0._20_4_;
        auVar155._8_4_ = fVar117 * (float)p0.field_0._24_4_ + fVar59 * (float)p1.field_0._24_4_;
        auVar155._12_4_ = fVar118 * (float)p0.field_0._28_4_ + fVar60 * (float)p1.field_0._28_4_;
        auVar163._0_4_ = fVar104 * (float)p0.field_0._32_4_ + fVar46 * (float)p1.field_0._32_4_;
        auVar163._4_4_ = fVar116 * (float)p0.field_0._36_4_ + fVar58 * (float)p1.field_0._36_4_;
        auVar163._8_4_ = fVar117 * (float)p0.field_0._40_4_ + fVar59 * (float)p1.field_0._40_4_;
        auVar163._12_4_ = fVar118 * (float)p0.field_0._44_4_ + fVar60 * (float)p1.field_0._44_4_;
      }
      local_1718 = *(undefined8 *)(lVar38 + 0x30);
      uStack_1710 = *(undefined8 *)(lVar38 + 0x38);
      auVar69 = *(undefined1 (*) [16])ray;
      auVar70 = *(undefined1 (*) [16])(ray + 0x10);
      auVar55 = *(undefined1 (*) [16])(ray + 0x20);
      auVar119 = vsubps_avx(auVar92,auVar69);
      auVar120 = vsubps_avx(auVar74,auVar70);
      auVar105 = vsubps_avx(auVar131,auVar55);
      auVar121 = vsubps_avx(auVar115,auVar69);
      auVar156 = vsubps_avx(auVar103,auVar70);
      auVar157 = vsubps_avx(auVar140,auVar55);
      auVar170 = vsubps_avx(auVar176,auVar69);
      auVar47 = vsubps_avx(auVar155,auVar70);
      auVar55 = vsubps_avx(auVar163,auVar55);
      auVar48 = vsubps_avx(auVar170,auVar119);
      auVar49 = vsubps_avx(auVar47,auVar120);
      auVar84 = vsubps_avx(auVar55,auVar105);
      auVar100._0_4_ = auVar170._0_4_ + auVar119._0_4_;
      auVar100._4_4_ = auVar170._4_4_ + auVar119._4_4_;
      auVar100._8_4_ = auVar170._8_4_ + auVar119._8_4_;
      auVar100._12_4_ = auVar170._12_4_ + auVar119._12_4_;
      auVar137._0_4_ = auVar120._0_4_ + auVar47._0_4_;
      auVar137._4_4_ = auVar120._4_4_ + auVar47._4_4_;
      auVar137._8_4_ = auVar120._8_4_ + auVar47._8_4_;
      auVar137._12_4_ = auVar120._12_4_ + auVar47._12_4_;
      fVar46 = auVar105._0_4_;
      auVar153._0_4_ = auVar55._0_4_ + fVar46;
      fVar58 = auVar105._4_4_;
      auVar153._4_4_ = auVar55._4_4_ + fVar58;
      fVar59 = auVar105._8_4_;
      auVar153._8_4_ = auVar55._8_4_ + fVar59;
      fVar60 = auVar105._12_4_;
      auVar153._12_4_ = auVar55._12_4_ + fVar60;
      auVar169._0_4_ = auVar84._0_4_ * auVar137._0_4_;
      auVar169._4_4_ = auVar84._4_4_ * auVar137._4_4_;
      auVar169._8_4_ = auVar84._8_4_ * auVar137._8_4_;
      auVar169._12_4_ = auVar84._12_4_ * auVar137._12_4_;
      auVar74 = vfmsub231ps_fma(auVar169,auVar49,auVar153);
      auVar162._0_4_ = auVar153._0_4_ * auVar48._0_4_;
      auVar162._4_4_ = auVar153._4_4_ * auVar48._4_4_;
      auVar162._8_4_ = auVar153._8_4_ * auVar48._8_4_;
      auVar162._12_4_ = auVar153._12_4_ * auVar48._12_4_;
      auVar70 = vfmsub231ps_fma(auVar162,auVar84,auVar100);
      auVar101._0_4_ = auVar100._0_4_ * auVar49._0_4_;
      auVar101._4_4_ = auVar100._4_4_ * auVar49._4_4_;
      auVar101._8_4_ = auVar100._8_4_ * auVar49._8_4_;
      auVar101._12_4_ = auVar100._12_4_ * auVar49._12_4_;
      auVar85 = vfmsub231ps_fma(auVar101,auVar48,auVar137);
      auVar69 = *(undefined1 (*) [16])(ray + 0x60);
      fVar174 = auVar69._0_4_;
      auVar173._0_4_ = fVar174 * auVar85._0_4_;
      fVar177 = auVar69._4_4_;
      auVar173._4_4_ = fVar177 * auVar85._4_4_;
      fVar178 = auVar69._8_4_;
      auVar173._8_4_ = fVar178 * auVar85._8_4_;
      fVar179 = auVar69._12_4_;
      auVar173._12_4_ = fVar179 * auVar85._12_4_;
      auVar69 = *(undefined1 (*) [16])(ray + 0x50);
      auVar85 = vfmadd231ps_fma(auVar173,auVar69,auVar70);
      auVar70 = *(undefined1 (*) [16])(ray + 0x40);
      auVar103 = vfmadd231ps_fma(auVar85,auVar70,auVar74);
      auVar85 = vsubps_avx(auVar120,auVar156);
      auVar74 = vsubps_avx(auVar105,auVar157);
      auVar138._0_4_ = auVar120._0_4_ + auVar156._0_4_;
      auVar138._4_4_ = auVar120._4_4_ + auVar156._4_4_;
      auVar138._8_4_ = auVar120._8_4_ + auVar156._8_4_;
      auVar138._12_4_ = auVar120._12_4_ + auVar156._12_4_;
      auVar180._0_4_ = fVar46 + auVar157._0_4_;
      auVar180._4_4_ = fVar58 + auVar157._4_4_;
      auVar180._8_4_ = fVar59 + auVar157._8_4_;
      auVar180._12_4_ = fVar60 + auVar157._12_4_;
      fVar104 = auVar74._0_4_;
      auVar126._0_4_ = auVar138._0_4_ * fVar104;
      fVar118 = auVar74._4_4_;
      auVar126._4_4_ = auVar138._4_4_ * fVar118;
      fVar142 = auVar74._8_4_;
      auVar126._8_4_ = auVar138._8_4_ * fVar142;
      fVar164 = auVar74._12_4_;
      auVar126._12_4_ = auVar138._12_4_ * fVar164;
      auVar92 = vfmsub231ps_fma(auVar126,auVar85,auVar180);
      auVar73 = vsubps_avx(auVar119,auVar121);
      fVar116 = auVar73._0_4_;
      auVar181._0_4_ = auVar180._0_4_ * fVar116;
      fVar132 = auVar73._4_4_;
      auVar181._4_4_ = auVar180._4_4_ * fVar132;
      fVar143 = auVar73._8_4_;
      auVar181._8_4_ = auVar180._8_4_ * fVar143;
      fVar165 = auVar73._12_4_;
      auVar181._12_4_ = auVar180._12_4_ * fVar165;
      auVar147._0_4_ = auVar121._0_4_ + auVar119._0_4_;
      auVar147._4_4_ = auVar121._4_4_ + auVar119._4_4_;
      auVar147._8_4_ = auVar121._8_4_ + auVar119._8_4_;
      auVar147._12_4_ = auVar121._12_4_ + auVar119._12_4_;
      auVar105 = vfmsub231ps_fma(auVar181,auVar74,auVar147);
      fVar117 = auVar85._0_4_;
      auVar148._0_4_ = auVar147._0_4_ * fVar117;
      fVar141 = auVar85._4_4_;
      auVar148._4_4_ = auVar147._4_4_ * fVar141;
      fVar159 = auVar85._8_4_;
      auVar148._8_4_ = auVar147._8_4_ * fVar159;
      fVar166 = auVar85._12_4_;
      auVar148._12_4_ = auVar147._12_4_ * fVar166;
      auVar131 = vfmsub231ps_fma(auVar148,auVar73,auVar138);
      auVar139._0_4_ = fVar174 * auVar131._0_4_;
      auVar139._4_4_ = fVar177 * auVar131._4_4_;
      auVar139._8_4_ = fVar178 * auVar131._8_4_;
      auVar139._12_4_ = fVar179 * auVar131._12_4_;
      auVar105 = vfmadd231ps_fma(auVar139,auVar69,auVar105);
      auVar131 = vfmadd231ps_fma(auVar105,auVar70,auVar92);
      auVar92 = vsubps_avx(auVar121,auVar170);
      auVar64._0_4_ = auVar121._0_4_ + auVar170._0_4_;
      auVar64._4_4_ = auVar121._4_4_ + auVar170._4_4_;
      auVar64._8_4_ = auVar121._8_4_ + auVar170._8_4_;
      auVar64._12_4_ = auVar121._12_4_ + auVar170._12_4_;
      auVar121 = vsubps_avx(auVar156,auVar47);
      auVar50._0_4_ = auVar156._0_4_ + auVar47._0_4_;
      auVar50._4_4_ = auVar156._4_4_ + auVar47._4_4_;
      auVar50._8_4_ = auVar156._8_4_ + auVar47._8_4_;
      auVar50._12_4_ = auVar156._12_4_ + auVar47._12_4_;
      auVar156 = vsubps_avx(auVar157,auVar55);
      auVar88._0_4_ = auVar157._0_4_ + auVar55._0_4_;
      auVar88._4_4_ = auVar157._4_4_ + auVar55._4_4_;
      auVar88._8_4_ = auVar157._8_4_ + auVar55._8_4_;
      auVar88._12_4_ = auVar157._12_4_ + auVar55._12_4_;
      auVar112._0_4_ = auVar156._0_4_ * auVar50._0_4_;
      auVar112._4_4_ = auVar156._4_4_ * auVar50._4_4_;
      auVar112._8_4_ = auVar156._8_4_ * auVar50._8_4_;
      auVar112._12_4_ = auVar156._12_4_ * auVar50._12_4_;
      auVar105 = vfmsub231ps_fma(auVar112,auVar121,auVar88);
      auVar89._0_4_ = auVar92._0_4_ * auVar88._0_4_;
      auVar89._4_4_ = auVar92._4_4_ * auVar88._4_4_;
      auVar89._8_4_ = auVar92._8_4_ * auVar88._8_4_;
      auVar89._12_4_ = auVar92._12_4_ * auVar88._12_4_;
      auVar55 = vfmsub231ps_fma(auVar89,auVar156,auVar64);
      auVar65._0_4_ = auVar121._0_4_ * auVar64._0_4_;
      auVar65._4_4_ = auVar121._4_4_ * auVar64._4_4_;
      auVar65._8_4_ = auVar121._8_4_ * auVar64._8_4_;
      auVar65._12_4_ = auVar121._12_4_ * auVar64._12_4_;
      auVar157 = vfmsub231ps_fma(auVar65,auVar92,auVar50);
      auVar51._0_4_ = fVar174 * auVar157._0_4_;
      auVar51._4_4_ = fVar177 * auVar157._4_4_;
      auVar51._8_4_ = fVar178 * auVar157._8_4_;
      auVar51._12_4_ = fVar179 * auVar157._12_4_;
      auVar55 = vfmadd231ps_fma(auVar51,auVar69,auVar55);
      auVar157 = vfmadd231ps_fma(auVar55,auVar70,auVar105);
      auVar127._0_4_ = auVar157._0_4_ + auVar103._0_4_ + auVar131._0_4_;
      auVar127._4_4_ = auVar157._4_4_ + auVar103._4_4_ + auVar131._4_4_;
      auVar127._8_4_ = auVar157._8_4_ + auVar103._8_4_ + auVar131._8_4_;
      auVar127._12_4_ = auVar157._12_4_ + auVar103._12_4_ + auVar131._12_4_;
      auVar55 = vandps_avx(auVar167,auVar127);
      auVar66._0_4_ = auVar55._0_4_ * 1.1920929e-07;
      auVar66._4_4_ = auVar55._4_4_ * 1.1920929e-07;
      auVar66._8_4_ = auVar55._8_4_ * 1.1920929e-07;
      auVar66._12_4_ = auVar55._12_4_ * 1.1920929e-07;
      auVar55 = vminps_avx(auVar103,auVar131);
      auVar55 = vminps_avx(auVar55,auVar157);
      uVar34 = CONCAT44(auVar66._4_4_,auVar66._0_4_);
      auVar113._0_8_ = uVar34 ^ 0x8000000080000000;
      auVar113._8_4_ = -auVar66._8_4_;
      auVar113._12_4_ = -auVar66._12_4_;
      auVar55 = vcmpps_avx(auVar55,auVar113,5);
      auVar105 = vmaxps_avx(auVar103,auVar131);
      auVar105 = vmaxps_avx(auVar105,auVar157);
      auVar105 = vcmpps_avx(auVar105,auVar66,2);
      auVar55 = vorps_avx(auVar55,auVar105);
      auVar105 = auVar62 & auVar55;
      auVar55 = vandps_avx(auVar55,auVar62);
      if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar105[0xf] < '\0') {
        auVar52._0_4_ = fVar117 * auVar84._0_4_;
        auVar52._4_4_ = fVar141 * auVar84._4_4_;
        auVar52._8_4_ = fVar159 * auVar84._8_4_;
        auVar52._12_4_ = fVar166 * auVar84._12_4_;
        auVar157 = vfmsub213ps_fma(auVar49,auVar74,auVar52);
        auVar90._0_4_ = auVar121._0_4_ * fVar104;
        auVar90._4_4_ = auVar121._4_4_ * fVar118;
        auVar90._8_4_ = auVar121._8_4_ * fVar142;
        auVar90._12_4_ = auVar121._12_4_ * fVar164;
        auVar114._0_4_ = auVar156._0_4_ * fVar116;
        auVar114._4_4_ = auVar156._4_4_ * fVar132;
        auVar114._8_4_ = auVar156._8_4_ * fVar143;
        auVar114._12_4_ = auVar156._12_4_ * fVar165;
        auVar170 = vfmsub213ps_fma(auVar156,auVar85,auVar90);
        auVar105 = vandps_avx(auVar167,auVar52);
        auVar156 = vandps_avx(auVar167,auVar90);
        auVar105 = vcmpps_avx(auVar105,auVar156,1);
        auVar157 = vblendvps_avx(auVar170,auVar157,auVar105);
        auVar128._0_4_ = auVar92._0_4_ * fVar117;
        auVar128._4_4_ = auVar92._4_4_ * fVar141;
        auVar128._8_4_ = auVar92._8_4_ * fVar159;
        auVar128._12_4_ = auVar92._12_4_ * fVar166;
        auVar170 = vfmsub213ps_fma(auVar92,auVar74,auVar114);
        auVar91._0_4_ = fVar104 * auVar48._0_4_;
        auVar91._4_4_ = fVar118 * auVar48._4_4_;
        auVar91._8_4_ = fVar142 * auVar48._8_4_;
        auVar91._12_4_ = fVar164 * auVar48._12_4_;
        auVar47 = vfmsub213ps_fma(auVar84,auVar73,auVar91);
        auVar105 = vandps_avx(auVar167,auVar91);
        auVar156 = vandps_avx(auVar167,auVar114);
        auVar105 = vcmpps_avx(auVar105,auVar156,1);
        auVar156 = vblendvps_avx(auVar170,auVar47,auVar105);
        auVar15._4_4_ = fVar132 * auVar49._4_4_;
        auVar15._0_4_ = fVar116 * auVar49._0_4_;
        auVar15._8_4_ = fVar143 * auVar49._8_4_;
        auVar15._12_4_ = fVar165 * auVar49._12_4_;
        auVar170 = vfmsub213ps_fma(auVar48,auVar85,auVar15);
        auVar47 = vfmsub213ps_fma(auVar121,auVar73,auVar128);
        auVar105 = vandps_avx(auVar167,auVar15);
        auVar121 = vandps_avx(auVar167,auVar128);
        auVar105 = vcmpps_avx(auVar105,auVar121,1);
        auVar105 = vblendvps_avx(auVar47,auVar170,auVar105);
        auVar67._0_4_ = auVar105._0_4_ * fVar174;
        auVar67._4_4_ = auVar105._4_4_ * fVar177;
        auVar67._8_4_ = auVar105._8_4_ * fVar178;
        auVar67._12_4_ = auVar105._12_4_ * fVar179;
        auVar69 = vfmadd213ps_fma(auVar69,auVar156,auVar67);
        auVar69 = vfmadd213ps_fma(auVar70,auVar157,auVar69);
        auVar68._0_4_ = auVar69._0_4_ + auVar69._0_4_;
        auVar68._4_4_ = auVar69._4_4_ + auVar69._4_4_;
        auVar68._8_4_ = auVar69._8_4_ + auVar69._8_4_;
        auVar68._12_4_ = auVar69._12_4_ + auVar69._12_4_;
        auVar129._0_4_ = auVar105._0_4_ * fVar46;
        auVar129._4_4_ = auVar105._4_4_ * fVar58;
        auVar129._8_4_ = auVar105._8_4_ * fVar59;
        auVar129._12_4_ = auVar105._12_4_ * fVar60;
        auVar69 = vfmadd213ps_fma(auVar120,auVar156,auVar129);
        auVar70 = vfmadd213ps_fma(auVar119,auVar157,auVar69);
        auVar69 = vrcpps_avx(auVar68);
        auVar158._8_4_ = 0x3f800000;
        auVar158._0_8_ = 0x3f8000003f800000;
        auVar158._12_4_ = 0x3f800000;
        auVar119 = vfnmadd213ps_fma(auVar69,auVar68,auVar158);
        auVar69 = vfmadd132ps_fma(auVar119,auVar69,auVar69);
        auVar130._0_4_ = auVar69._0_4_ * (auVar70._0_4_ + auVar70._0_4_);
        auVar130._4_4_ = auVar69._4_4_ * (auVar70._4_4_ + auVar70._4_4_);
        auVar130._8_4_ = auVar69._8_4_ * (auVar70._8_4_ + auVar70._8_4_);
        auVar130._12_4_ = auVar69._12_4_ * (auVar70._12_4_ + auVar70._12_4_);
        auVar69 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar130,2);
        auVar70 = vcmpps_avx(auVar130,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar69 = vandps_avx(auVar70,auVar69);
        uVar34 = CONCAT44(auVar68._4_4_,auVar68._0_4_);
        auVar154._0_8_ = uVar34 ^ 0x8000000080000000;
        auVar154._8_4_ = -auVar68._8_4_;
        auVar154._12_4_ = -auVar68._12_4_;
        auVar70 = vcmpps_avx(auVar154,auVar68,4);
        auVar69 = vandps_avx(auVar70,auVar69);
        auVar69 = vpslld_avx(auVar69,0x1f);
        auVar70 = vpsrad_avx(auVar69,0x1f);
        auVar69 = auVar55 & auVar70;
        auVar55 = vandps_avx(auVar70,auVar55);
        if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar69[0xf] < '\0') {
          local_1848 = auVar105;
          local_1838 = auVar156;
          local_1828 = auVar157;
          local_1808 = auVar127;
          _local_17f8 = auVar131;
          _local_17e8 = auVar103;
        }
      }
      auVar182 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      uVar4 = *(uint *)((long)&local_1718 + (long)pRVar45 * 4);
      pGVar8 = pRVar7[uVar4].ptr;
      uVar31 = pGVar8->mask;
      auVar53._4_4_ = uVar31;
      auVar53._0_4_ = uVar31;
      auVar53._8_4_ = uVar31;
      auVar53._12_4_ = uVar31;
      auVar69 = vpand_avx(auVar53,*(undefined1 (*) [16])(ray + 0x90));
      auVar69 = vpcmpeqd_avx(auVar69,_DAT_01f45a50);
      auVar70 = auVar55 & ~auVar69;
      pRVar36 = pRVar45;
      if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar70[0xf] < '\0'
         ) {
        pRVar36 = (RTCIntersectArguments *)0x0;
        auVar69 = vandnps_avx(auVar69,auVar55);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar70 = vandps_avx(auVar167,local_1808);
          auVar55 = vrcpps_avx(local_1808);
          auVar102._8_4_ = 0x3f800000;
          auVar102._0_8_ = 0x3f8000003f800000;
          auVar102._12_4_ = 0x3f800000;
          auVar105 = vfnmadd213ps_fma(auVar55,local_1808,auVar102);
          auVar55 = vfmadd132ps_fma(auVar105,auVar55,auVar55);
          auVar71._8_4_ = 0x219392ef;
          auVar71._0_8_ = 0x219392ef219392ef;
          auVar71._12_4_ = 0x219392ef;
          auVar70 = vcmpps_avx(auVar70,auVar71,5);
          auVar70 = vandps_avx(auVar70,auVar55);
          auVar72._0_4_ = auVar70._0_4_ * (float)local_17e8._0_4_;
          auVar72._4_4_ = auVar70._4_4_ * (float)local_17e8._4_4_;
          auVar72._8_4_ = auVar70._8_4_ * fStack_17e0;
          auVar72._12_4_ = auVar70._12_4_ * fStack_17dc;
          vminps_avx(auVar72,auVar102);
          auVar54._0_4_ = auVar70._0_4_ * (float)local_17f8._0_4_;
          auVar54._4_4_ = auVar70._4_4_ * (float)local_17f8._4_4_;
          auVar54._8_4_ = auVar70._8_4_ * fStack_17f0;
          auVar54._12_4_ = auVar70._12_4_ * fStack_17ec;
          vminps_avx(auVar54,auVar102);
          p0.field_0._0_8_ = local_1828._0_8_;
          p0.field_0._8_8_ = local_1828._8_8_;
          p0.field_0._16_8_ = local_1838._0_8_;
          p0.field_0._24_8_ = local_1838._8_8_;
          p0.field_0._32_8_ = local_1848._0_8_;
          p0.field_0._40_8_ = local_1848._8_8_;
          p1.field_0._0_8_ = &itime;
          p1.field_0._8_8_ = &t;
          p1.field_0._16_8_ = &v_2;
          p1.field_0._24_8_ = &u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                             *)&p0);
          p0.field_0._0_8_ = itime.field_0.v[0];
          p0.field_0._8_8_ = itime.field_0.v[1];
          p0.field_0._16_8_ = local_1958;
          p0.field_0._24_8_ = uStack_1950;
          p0.field_0._32_8_ = uStack_1948;
          p0.field_0._40_8_ = uStack_1940;
          pRVar36 = &local_1988;
          auVar57 = ZEXT1632(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))));
          vpcmpeqd_avx2(auVar57,auVar57);
          local_1988.feature_mask = context->user->instID[0];
          local_1988.flags = local_1988.feature_mask;
          local_1988.context._0_4_ = local_1988.feature_mask;
          local_1988.context._4_4_ = local_1988.feature_mask;
          local_1988.filter._0_4_ = context->user->instPrimID[0];
          local_1988.filter._4_4_ = (uint)local_1988.filter;
          local_1988.intersect._0_4_ = (uint)local_1988.filter;
          local_1988.intersect._4_4_ = (uint)local_1988.filter;
          auVar70 = *(undefined1 (*) [16])(ray + 0x80);
          auVar55 = vblendvps_avx(auVar70,(undefined1  [16])t.field_0,auVar69);
          *(undefined1 (*) [16])(ray + 0x80) = auVar55;
          p1.field_0._0_8_ = local_1a28;
          p1.field_0._8_8_ = pGVar8->userPtr;
          p1.field_0._16_8_ = context->user;
          p1.field_0._32_8_ = &p0;
          p1.field_0._40_4_ = 4;
          p1.field_0._24_8_ = ray;
          local_1a28 = auVar69;
          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar8->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
          }
          if (local_1a28 == (undefined1  [16])0x0) {
            auVar69 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
            auVar69 = auVar69 ^ _DAT_01f46b70;
            auVar182 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          }
          else {
            pRVar36 = context->args;
            if (pRVar36->filter == (RTCFilterFunctionN)0x0) {
              auVar182 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            }
            else {
              auVar182 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              if (((pRVar36->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                (*pRVar36->filter)((RTCFilterFunctionNArguments *)&p1);
                auVar182 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              }
            }
            auVar55 = vpcmpeqd_avx(local_1a28,_DAT_01f45a50);
            auVar69 = auVar55 ^ _DAT_01f46b70;
            auVar93._8_4_ = 0xff800000;
            auVar93._0_8_ = 0xff800000ff800000;
            auVar93._12_4_ = 0xff800000;
            auVar55 = vblendvps_avx(auVar93,*(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),auVar55
                                   );
            *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar55;
          }
          auVar55 = vpslld_avx(auVar69,0x1f);
          auVar69 = vpsrad_avx(auVar55,0x1f);
          auVar3._0_4_ = pRVar1->flags;
          auVar3._4_4_ = pRVar1->feature_mask;
          auVar3._8_8_ = pRVar1->context;
          auVar70 = vblendvps_avx(auVar70,auVar3,auVar55);
          pRVar1->flags = auVar70._0_4_;
          pRVar1->feature_mask = auVar70._4_4_;
          pRVar1->context = (RTCRayQueryContext *)auVar70._8_8_;
        }
        auVar62 = vpandn_avx(auVar69,auVar62);
      }
      pRVar45 = (RTCIntersectArguments *)((long)&pRVar45->flags + 1);
    } while ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar62[0xf] < '\0');
    auVar76 = ZEXT1664(local_1a68);
    auVar70 = vandps_avx(auVar62,local_1a68);
    lVar37 = lVar37 + 1;
    auVar62 = local_1a68 & auVar62;
    auVar69 = local_1a68;
    local_1a68 = auVar70;
  } while ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar62[0xf] < '\0');
  auVar69 = vpcmpeqd_avx(auVar69,auVar69);
  auVar56._0_4_ = local_1a68._0_4_ ^ auVar69._0_4_;
  auVar56._4_4_ = local_1a68._4_4_ ^ auVar69._4_4_;
  auVar56._8_4_ = local_1a68._8_4_ ^ auVar69._8_4_;
  auVar56._12_4_ = local_1a68._12_4_ ^ auVar69._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar56,(undefined1  [16])terminated.field_0);
  auVar69 = auVar69 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar69 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar69 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar69[0xf])
  goto LAB_01549055;
  auVar94._8_4_ = 0xff800000;
  auVar94._0_8_ = 0xff800000ff800000;
  auVar94._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar94,
                     (undefined1  [16])terminated.field_0);
  goto LAB_01547f98;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }